

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int thread_tcache_flush_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long in_RCX;
  byte *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int ret;
  uint8_t state;
  undefined4 local_6c;
  
  if ((*in_RDI & 1) == 0) {
    local_6c = 0xe;
  }
  else if ((((in_RCX == 0) && (in_R8 == 0)) && (in_R9 == 0)) && (in_stack_00000008 == 0)) {
    duckdb_je_tcache_flush((tsd_t *)0x24d6cf0);
    local_6c = 0;
  }
  else {
    local_6c = 1;
  }
  return local_6c;
}

Assistant:

static int
thread_tcache_flush_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;

	if (!tcache_available(tsd)) {
		ret = EFAULT;
		goto label_return;
	}

	NEITHER_READ_NOR_WRITE();

	tcache_flush(tsd);

	ret = 0;
label_return:
	return ret;
}